

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

Iterator aom_vector_iterator(Vector *vector,size_t index)

{
  void *pvVar1;
  size_t sVar2;
  Iterator IVar3;
  
  if (vector != (Vector *)0x0) {
    sVar2 = 0;
    pvVar1 = (void *)0x0;
    if (index <= vector->size) {
      sVar2 = vector->element_size;
      if (sVar2 == 0) goto LAB_0022ca31;
      pvVar1 = (void *)(index * sVar2 + (long)vector->data);
    }
    IVar3.element_size = sVar2;
    IVar3.pointer = pvVar1;
    return IVar3;
  }
LAB_0022ca31:
  return (Iterator)ZEXT816(0);
}

Assistant:

Iterator aom_vector_iterator(Vector *vector, size_t index) {
  Iterator iterator = { NULL, 0 };

  assert(vector != NULL);
  assert(index <= vector->size);

  if (vector == NULL) return iterator;
  if (index > vector->size) return iterator;
  if (vector->element_size == 0) return iterator;

  iterator.pointer = _vector_offset(vector, index);
  iterator.element_size = vector->element_size;

  return iterator;
}